

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalNinjaGenerator.cxx
# Opt level: O0

void __thiscall
cmLocalNinjaGenerator::AdditionalCleanFiles(cmLocalNinjaGenerator *this,string *config)

{
  cmMakefile *this_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  init;
  cmValue config_00;
  bool bVar1;
  string *psVar2;
  cmGlobalNinjaGenerator *this_01;
  string *local_178;
  string local_140;
  reference local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *cleanFile;
  iterator __end2;
  iterator __begin2;
  cmList *__range2;
  cmGlobalNinjaGenerator *gg;
  string *binaryDir;
  string local_e8;
  string local_c8;
  string *local_a8;
  string local_a0;
  iterator local_80;
  size_type local_78;
  undefined1 local_70 [8];
  cmList cleanFiles;
  allocator<char> local_41;
  string local_40;
  cmValue local_20;
  cmValue prop_value;
  string *config_local;
  cmLocalNinjaGenerator *this_local;
  
  this_00 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
  prop_value.Value = config;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"ADDITIONAL_CLEAN_FILES",&local_41);
  local_20 = cmMakefile::GetProperty(this_00,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  bVar1 = cmValue::operator_cast_to_bool(&local_20);
  if (bVar1) {
    local_a8 = &local_a0;
    psVar2 = cmValue::operator*[abi_cxx11_(&local_20);
    std::__cxx11::string::string((string *)&local_c8,(string *)psVar2);
    config_00 = prop_value;
    std::__cxx11::string::string((string *)&local_e8);
    cmGeneratorExpression::Evaluate
              (&local_a0,&local_c8,(cmLocalGenerator *)this,config_00.Value,(cmGeneratorTarget *)0x0
               ,(cmGeneratorExpressionDAGChecker *)0x0,(cmGeneratorTarget *)0x0,&local_e8);
    local_80 = &local_a0;
    local_78 = 1;
    init._M_len = 1;
    init._M_array = local_80;
    cmList::cmList((cmList *)local_70,init);
    local_178 = (string *)&local_80;
    do {
      local_178 = local_178 + -1;
      std::__cxx11::string::~string((string *)local_178);
    } while (local_178 != &local_a0);
    std::__cxx11::string::~string((string *)&local_e8);
    std::__cxx11::string::~string((string *)&local_c8);
    psVar2 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_((cmLocalGenerator *)this);
    this_01 = GetGlobalNinjaGenerator(this);
    __end2 = cmList::begin_abi_cxx11_((cmList *)local_70);
    cleanFile = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                cmList::end_abi_cxx11_((cmList *)local_70);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&cleanFile), bVar1) {
      local_120 = __gnu_cxx::
                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator*(&__end2);
      cmsys::SystemTools::CollapseFullPath(&local_140,local_120,psVar2);
      cmGlobalNinjaGenerator::AddAdditionalCleanFile(this_01,&local_140,prop_value.Value);
      std::__cxx11::string::~string((string *)&local_140);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2);
    }
    cmList::~cmList((cmList *)local_70);
  }
  return;
}

Assistant:

void cmLocalNinjaGenerator::AdditionalCleanFiles(const std::string& config)
{
  if (cmValue prop_value =
        this->Makefile->GetProperty("ADDITIONAL_CLEAN_FILES")) {
    cmList cleanFiles{ cmGeneratorExpression::Evaluate(*prop_value, this,
                                                       config) };
    std::string const& binaryDir = this->GetCurrentBinaryDirectory();
    cmGlobalNinjaGenerator* gg = this->GetGlobalNinjaGenerator();
    for (auto const& cleanFile : cleanFiles) {
      // Support relative paths
      gg->AddAdditionalCleanFile(
        cmSystemTools::CollapseFullPath(cleanFile, binaryDir), config);
    }
  }
}